

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_getEntityFromId_Test::~Annotator_getEntityFromId_Test
          (Annotator_getEntityFromId_Test *this)

{
  Annotator_getEntityFromId_Test *this_local;
  
  ~Annotator_getEntityFromId_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Annotator, getEntityFromId)
{
    auto model = libcellml::Model::create("model");
    auto component = libcellml::Component::create("component");
    auto variable = libcellml::Variable::create("variable");
    auto reset = libcellml::Reset::create();
    auto units = libcellml::Units::create("units");
    auto importSource = libcellml::ImportSource::create();

    auto annotator = libcellml::Annotator::create();

    model->setId("model_id");
    component->setId("component_id");
    reset->setId("reset_id");
    variable->setId("variable_id");
    units->setId("units_id");
    importSource->setId("import_id");

    component->addVariable(variable);
    component->addReset(reset);
    component->setImportSource(importSource);
    model->addComponent(component);
    model->addUnits(units);

    annotator->setModel(model);

    EXPECT_EQ(libcellml::CellmlElementType::MODEL, annotator->item("model_id")->type());
    EXPECT_EQ(model, annotator->item("model_id")->model());

    EXPECT_EQ(libcellml::CellmlElementType::COMPONENT, annotator->item("component_id")->type());
    EXPECT_EQ(component, annotator->item("component_id")->component());
    EXPECT_EQ(libcellml::CellmlElementType::VARIABLE, annotator->item("variable_id")->type());
    EXPECT_EQ(variable, annotator->item("variable_id")->variable());
    EXPECT_EQ(libcellml::CellmlElementType::RESET, annotator->item("reset_id")->type());
    EXPECT_EQ(reset, annotator->item("reset_id")->reset());
    EXPECT_EQ(libcellml::CellmlElementType::UNITS, annotator->item("units_id")->type());
    EXPECT_EQ(units, annotator->item("units_id")->units());
    EXPECT_EQ(libcellml::CellmlElementType::IMPORT, annotator->item("import_id")->type());
    EXPECT_EQ(importSource, annotator->item("import_id")->importSource());
}